

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O3

void __thiscall QGridLayoutPrivate::setupHfwLayoutData(QGridLayoutPrivate *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  QList<QLayoutStruct> *this_00;
  QLayoutStruct *pQVar4;
  QGridBox *this_01;
  int end;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  pointer pQVar11;
  int extraout_var;
  int extraout_var_00;
  ulong uVar12;
  bool bVar13;
  int minSize;
  uint width;
  long lVar14;
  long lVar15;
  ulong uVar16;
  
  this_00 = this->hfwData;
  if (0 < this->rr) {
    lVar14 = 0;
    lVar15 = 0;
    do {
      pQVar4 = (this->rowData).d.ptr;
      pQVar11 = QList<QLayoutStruct>::data(this_00);
      puVar1 = (undefined8 *)((long)&pQVar4->stretch + lVar14);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pQVar4->spacing + lVar14);
      uVar6 = *puVar2;
      uVar7 = puVar2[1];
      puVar2 = (undefined8 *)((long)&pQVar11->stretch + lVar14);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      puVar1 = (undefined8 *)((long)&pQVar11->spacing + lVar14);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      iVar3 = (this->rMinHeights).d.ptr[lVar15];
      pQVar11 = QList<QLayoutStruct>::data(this_00);
      *(int *)((long)&pQVar11->sizeHint + lVar14) = iVar3;
      pQVar11 = QList<QLayoutStruct>::data(this_00);
      *(int *)((long)&pQVar11->minimumSize + lVar14) = iVar3;
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0x20;
    } while (lVar15 < this->rr);
  }
  uVar12 = (this->things).d.size;
  bVar13 = true;
  do {
    bVar8 = bVar13;
    if (uVar12 == 0) {
      uVar12 = 0;
    }
    else {
      uVar16 = 0;
      do {
        this_01 = (this->things).d.ptr[uVar16];
        iVar3 = this_01->row;
        end = this->rr + -1;
        if (-1 < this_01->torow) {
          end = this_01->torow;
        }
        iVar9 = this->cc + -1;
        if (-1 < this_01->tocol) {
          iVar9 = this_01->tocol;
        }
        pQVar4 = (this->colData).d.ptr;
        width = (pQVar4[iVar9].size + pQVar4[iVar9].pos) - pQVar4[this_01->col].pos;
        if (iVar3 == end) {
          if (bVar8) {
            addHfwData(this,this_01,width);
          }
        }
        else if (bVar8) {
          initEmptyMultiBox(this_00,iVar3,end);
        }
        else {
          (*this_01->item_->_vptr_QLayoutItem[2])();
          (*this_01->item_->_vptr_QLayoutItem[3])();
          iVar10 = (*this_01->item_->_vptr_QLayoutItem[9])();
          iVar9 = extraout_var;
          minSize = extraout_var_00;
          if ((char)iVar10 != '\0') {
            iVar10 = (*this_01->item_->_vptr_QLayoutItem[10])(this_01->item_,(ulong)width);
            iVar9 = extraout_var;
            if (extraout_var < iVar10) {
              iVar9 = iVar10;
            }
            minSize = extraout_var_00;
            if (extraout_var_00 < iVar10) {
              minSize = iVar10;
            }
          }
          iVar10 = QGridBox::vStretch(this_01);
          distributeMultiBox(this_00,iVar3,end,minSize,iVar9,&this->rStretch,iVar10);
        }
        uVar16 = uVar16 + 1;
        uVar12 = (this->things).d.size;
      } while (uVar16 < uVar12);
    }
    bVar13 = false;
  } while (bVar8);
  if (0 < this->rr) {
    lVar14 = 0x14;
    lVar15 = 0;
    do {
      pQVar4 = (this_00->d).ptr;
      bVar13 = true;
      if (*(char *)((long)&pQVar4->stretch + lVar14) == '\0') {
        bVar13 = 0 < *(int *)((long)pQVar4 + lVar14 + -0x14);
      }
      pQVar11 = QList<QLayoutStruct>::data(this_00);
      *(bool *)((long)&pQVar11->stretch + lVar14) = bVar13;
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0x20;
    } while (lVar15 < this->rr);
  }
  return;
}

Assistant:

void QGridLayoutPrivate::setupHfwLayoutData()
{
    QList<QLayoutStruct> &rData = *hfwData;
    for (int i = 0; i < rr; i++) {
        rData[i] = rowData.at(i);
        rData[i].minimumSize = rData[i].sizeHint = rMinHeights.at(i);
    }

    for (int pass = 0; pass < 2; ++pass) {
        for (int i = 0; i < things.size(); ++i) {
            QGridBox *box = things.at(i);
            int r1 = box->row;
            int c1 = box->col;
            int r2 = box->toRow(rr);
            int c2 = box->toCol(cc);
            int w = colData.at(c2).pos + colData.at(c2).size - colData.at(c1).pos;

            if (r1 == r2) {
                if (pass == 0)
                    addHfwData(box, w);
            } else {
                if (pass == 0) {
                    initEmptyMultiBox(rData, r1, r2);
                } else {
                    QSize hint = box->sizeHint();
                    QSize min = box->minimumSize();
                    if (box->hasHeightForWidth()) {
                        int hfwh = box->heightForWidth(w);
                        if (hfwh > hint.height())
                            hint.setHeight(hfwh);
                        if (hfwh > min.height())
                            min.setHeight(hfwh);
                    }
                    distributeMultiBox(rData, r1, r2, min.height(), hint.height(),
                                       rStretch, box->vStretch());
                }
            }
        }
    }
    for (int i = 0; i < rr; i++)
        rData[i].expansive = rData.at(i).expansive || rData.at(i).stretch > 0;
}